

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestWellKnownTypes::_InternalSerialize
          (TestWellKnownTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  Any *value;
  Api *value_00;
  Duration *value_01;
  MessageLite *value_02;
  FieldMask *value_03;
  SourceContext *value_04;
  Struct *value_05;
  Timestamp *value_06;
  Type *value_07;
  DoubleValue *value_08;
  FloatValue *value_09;
  Int64Value *value_10;
  UInt64Value *value_11;
  Int32Value *value_12;
  UInt32Value *value_13;
  BoolValue *value_14;
  StringValue *value_15;
  BytesValue *value_16;
  Value *value_17;
  bool bVar2;
  int iVar3;
  uint32_t *puVar4;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestWellKnownTypes *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestWellKnownTypes *this_local;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.any_field_;
    iVar3 = google::protobuf::Any::GetCachedSize((this->field_0)._impl_.any_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)value,iVar3,target,stream);
  }
  if ((uVar1 & 2) != 0) {
    value_00 = (this->field_0)._impl_.api_field_;
    iVar3 = google::protobuf::Api::GetCachedSize((this->field_0)._impl_.api_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)value_00,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 4) != 0) {
    value_01 = (this->field_0)._impl_.duration_field_;
    iVar3 = google::protobuf::Duration::GetCachedSize((this->field_0)._impl_.duration_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value_01,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 8) != 0) {
    value_02 = (MessageLite *)(this->field_0)._impl_.empty_field_;
    iVar3 = google::protobuf::internal::ZeroFieldsBase::GetCachedSize
                      (&((this->field_0)._impl_.empty_field_)->super_ZeroFieldsBase);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,value_02,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    value_03 = (this->field_0)._impl_.field_mask_field_;
    iVar3 = google::protobuf::FieldMask::GetCachedSize((this->field_0)._impl_.field_mask_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)value_03,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x20) != 0) {
    value_04 = (this->field_0)._impl_.source_context_field_;
    iVar3 = google::protobuf::SourceContext::GetCachedSize
                      ((this->field_0)._impl_.source_context_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)value_04,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x40) != 0) {
    value_05 = (this->field_0)._impl_.struct_field_;
    iVar3 = google::protobuf::Struct::GetCachedSize((this->field_0)._impl_.struct_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (7,(MessageLite *)value_05,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x80) != 0) {
    value_06 = (this->field_0)._impl_.timestamp_field_;
    iVar3 = google::protobuf::Timestamp::GetCachedSize((this->field_0)._impl_.timestamp_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (8,(MessageLite *)value_06,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x100) != 0) {
    value_07 = (this->field_0)._impl_.type_field_;
    iVar3 = google::protobuf::Type::GetCachedSize((this->field_0)._impl_.type_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (9,(MessageLite *)value_07,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x200) != 0) {
    value_08 = (this->field_0)._impl_.double_field_;
    iVar3 = google::protobuf::DoubleValue::GetCachedSize((this->field_0)._impl_.double_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (10,(MessageLite *)value_08,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x400) != 0) {
    value_09 = (this->field_0)._impl_.float_field_;
    iVar3 = google::protobuf::FloatValue::GetCachedSize((this->field_0)._impl_.float_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xb,(MessageLite *)value_09,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x800) != 0) {
    value_10 = (this->field_0)._impl_.int64_field_;
    iVar3 = google::protobuf::Int64Value::GetCachedSize((this->field_0)._impl_.int64_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xc,(MessageLite *)value_10,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x1000) != 0) {
    value_11 = (this->field_0)._impl_.uint64_field_;
    iVar3 = google::protobuf::UInt64Value::GetCachedSize((this->field_0)._impl_.uint64_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xd,(MessageLite *)value_11,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x2000) != 0) {
    value_12 = (this->field_0)._impl_.int32_field_;
    iVar3 = google::protobuf::Int32Value::GetCachedSize((this->field_0)._impl_.int32_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xe,(MessageLite *)value_12,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x4000) != 0) {
    value_13 = (this->field_0)._impl_.uint32_field_;
    iVar3 = google::protobuf::UInt32Value::GetCachedSize((this->field_0)._impl_.uint32_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xf,(MessageLite *)value_13,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x8000) != 0) {
    value_14 = (this->field_0)._impl_.bool_field_;
    iVar3 = google::protobuf::BoolValue::GetCachedSize((this->field_0)._impl_.bool_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x10,(MessageLite *)value_14,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x10000) != 0) {
    value_15 = (this->field_0)._impl_.string_field_;
    iVar3 = google::protobuf::StringValue::GetCachedSize((this->field_0)._impl_.string_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x11,(MessageLite *)value_15,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x20000) != 0) {
    value_16 = (this->field_0)._impl_.bytes_field_;
    iVar3 = google::protobuf::BytesValue::GetCachedSize((this->field_0)._impl_.bytes_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x12,(MessageLite *)value_16,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 0x40000) != 0) {
    value_17 = (this->field_0)._impl_.value_field_;
    iVar3 = google::protobuf::Value::GetCachedSize((this->field_0)._impl_.value_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x13,(MessageLite *)value_17,iVar3,(uint8_t *)stream_local,stream);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestWellKnownTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestWellKnownTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestWellKnownTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .google.protobuf.Any any_field = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.any_field_, this_._impl_.any_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Api api_field = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.api_field_, this_._impl_.api_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Duration duration_field = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.duration_field_, this_._impl_.duration_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Empty empty_field = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.empty_field_, this_._impl_.empty_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.FieldMask field_mask_field = 5;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.field_mask_field_, this_._impl_.field_mask_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.SourceContext source_context_field = 6;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        6, *this_._impl_.source_context_field_, this_._impl_.source_context_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Struct struct_field = 7;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        7, *this_._impl_.struct_field_, this_._impl_.struct_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Timestamp timestamp_field = 8;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        8, *this_._impl_.timestamp_field_, this_._impl_.timestamp_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Type type_field = 9;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.type_field_, this_._impl_.type_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.DoubleValue double_field = 10;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        10, *this_._impl_.double_field_, this_._impl_.double_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.FloatValue float_field = 11;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        11, *this_._impl_.float_field_, this_._impl_.float_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Int64Value int64_field = 12;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        12, *this_._impl_.int64_field_, this_._impl_.int64_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.UInt64Value uint64_field = 13;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        13, *this_._impl_.uint64_field_, this_._impl_.uint64_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Int32Value int32_field = 14;
  if ((cached_has_bits & 0x00002000u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        14, *this_._impl_.int32_field_, this_._impl_.int32_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.UInt32Value uint32_field = 15;
  if ((cached_has_bits & 0x00004000u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        15, *this_._impl_.uint32_field_, this_._impl_.uint32_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.BoolValue bool_field = 16;
  if ((cached_has_bits & 0x00008000u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        16, *this_._impl_.bool_field_, this_._impl_.bool_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.StringValue string_field = 17;
  if ((cached_has_bits & 0x00010000u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        17, *this_._impl_.string_field_, this_._impl_.string_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.BytesValue bytes_field = 18;
  if ((cached_has_bits & 0x00020000u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        18, *this_._impl_.bytes_field_, this_._impl_.bytes_field_->GetCachedSize(), target,
        stream);
  }

  // .google.protobuf.Value value_field = 19;
  if ((cached_has_bits & 0x00040000u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        19, *this_._impl_.value_field_, this_._impl_.value_field_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestWellKnownTypes)
  return target;
}